

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFObjectHandle::newInteger(QPDFObjectHandle *this,longlong value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  undefined1 local_28 [24];
  longlong value_local;
  
  local_28._16_8_ = value;
  value_local = (longlong)this;
  QPDFObject::create<QPDF_Integer,long_long&>((QPDFObject *)local_28,(longlong *)(local_28 + 0x10));
  QPDFObjectHandle(this,(shared_ptr<QPDFObject> *)local_28);
  std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_28);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newInteger(long long value)
{
    return {QPDFObject::create<QPDF_Integer>(value)};
}